

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall r_exec::SGMonitor::commit(SGMonitor *this)

{
  bool bVar1;
  _Fact *this_00;
  Goal *this_01;
  reference ppVar2;
  Sim *pSVar3;
  Goal *pGVar4;
  double dVar5;
  double dVar6;
  iterator local_68;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_60;
  iterator local_58;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_50;
  iterator local_48;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_40;
  iterator local_38;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_30;
  _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_> local_28;
  const_iterator sol;
  uint64_t now;
  Goal *monitored_goal;
  SGMonitor *this_local;
  
  this_00 = &core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target)->
             super__Fact;
  this_01 = _Fact::get_goal(this_00);
  sol._M_node = (_List_node_base *)(*Now)();
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_28);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
       ::begin(&(this->super__GMonitor).sim_failures.mandatory_solutions);
  std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
  _List_const_iterator(&local_30,&local_38);
  local_28._M_node = local_30._M_node;
  do {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
         ::end(&(this->super__GMonitor).sim_failures.mandatory_solutions);
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
    _List_const_iterator(&local_40,&local_48);
    bVar1 = std::operator!=(&local_28,&local_40);
    if (!bVar1) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ::begin(&(this->super__GMonitor).sim_failures.optional_solutions);
      std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
      _List_const_iterator(&local_50,&local_58);
      local_28._M_node = local_50._M_node;
      while( true ) {
        local_68._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
             ::end(&(this->super__GMonitor).sim_failures.optional_solutions);
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        _List_const_iterator(&local_60,&local_68);
        bVar1 = std::operator!=(&local_28,&local_60);
        if (!bVar1) break;
        ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                 ::operator*(&local_28);
        pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
        bVar1 = Sim::is_invalidated(pSVar3);
        if (!bVar1) {
          ppVar2 = std::
                   _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
                   operator*(&local_28);
          pGVar4 = core::P<r_exec::Goal>::operator->(&ppVar2->first);
          dVar5 = Goal::get_strength(pGVar4,(uint64_t)sol._M_node);
          dVar6 = Goal::get_strength(this_01,(uint64_t)sol._M_node);
          if (dVar6 < dVar5) {
            ppVar2 = std::
                     _List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                     ::operator*(&local_28);
            pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
            Sim::invalidate(pSVar3);
          }
        }
        std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
        operator++(&local_28);
      }
      return;
    }
    ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
             operator*(&local_28);
    pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
    bVar1 = Sim::is_invalidated(pSVar3);
    if (!bVar1) {
      ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::
               operator*(&local_28);
      pGVar4 = core::P<r_exec::Goal>::operator->(&ppVar2->first);
      dVar5 = Goal::get_strength(pGVar4,(uint64_t)sol._M_node);
      dVar6 = Goal::get_strength(this_01,(uint64_t)sol._M_node);
      if (dVar6 < dVar5) {
        ppVar2 = std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>
                 ::operator*(&local_28);
        pSVar3 = core::P<r_exec::Sim>::operator->(&ppVar2->second);
        Sim::invalidate(pSVar3);
        return;
      }
    }
    std::_List_const_iterator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>::operator++
              (&local_28);
  } while( true );
}

Assistant:

void SGMonitor::commit()   // the purpose is to invalidate damaging simulations and let the rest flow upward.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            (*sol).second->invalidate();
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }
}